

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O1

void Gia_ManProfilePrintOne(Gia_Man_t *p,int i,Vec_Int_t *vArray)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  
  if ((i < 0) || (iVar4 = p->nObjs, iVar4 <= i)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar5 = *(ulong *)(p->pObjs + (uint)i);
  uVar3 = (uint)uVar5;
  uVar1 = (uint)(uVar5 >> 0x20);
  if (((uVar5 & 0x1fffffff) != 0x1fffffff && (int)uVar3 < 0) &&
     (p->vCos->nSize - p->nRegs <= (int)(uVar1 & 0x1fffffff))) {
    return;
  }
  if (((~uVar3 & 0x9fffffff) != 0) ||
     (uVar8 = 1, (int)(uVar1 & 0x1fffffff) < p->vCis->nSize - p->nRegs)) {
    if (iVar4 <= i) goto LAB_00220aa9;
    if ((p->pMuxes == (uint *)0x0) || (uVar8 = 3, p->pMuxes[(uint)i] == 0)) {
      iVar6 = (int)(uVar5 & 0x1fffffff);
      uVar8 = 2;
      if ((int)uVar3 < 0 || iVar6 == 0x1fffffff) {
        uVar8 = (ulong)((int)uVar3 < 0 && iVar6 != 0x1fffffff);
      }
    }
  }
  if (iVar4 <= i) {
LAB_00220aa9:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (i < p->vFanoutNums->nSize) {
    uVar3 = p->vFanoutNums->pArray[(uint)i];
    uVar5 = 0;
    printf("%6d : ");
    if ((int)uVar8 != 0) {
      uVar2 = 0;
      do {
        uVar5 = uVar2 + 1;
        if ((long)vArray->nSize <= (long)uVar5) goto LAB_00220a6b;
        printf("  %5s",GIA_TYPE_STRINGS[vArray->pArray[uVar2 + 1]]);
        uVar2 = uVar5;
      } while (uVar8 != uVar5);
    }
    if ((uint)uVar5 < 3) {
      iVar4 = (uint)uVar5 - 3;
      do {
        printf("  %5s","");
        iVar4 = iVar4 + 1;
      } while (iVar4 != 0);
    }
    printf("  ->");
    if (0 < vArray->nSize) {
      printf(" %5s",GIA_TYPE_STRINGS[*vArray->pArray]);
      printf("  ->");
      if (0 < (int)uVar3) {
        uVar1 = (int)uVar8 + 1;
        if (vArray->nSize <= (int)uVar1) goto LAB_00220a6b;
        iVar4 = vArray->pArray[uVar1];
        uVar5 = 1;
        if (uVar3 != 1) {
          lVar7 = (ulong)uVar3 - 1;
          lVar9 = uVar8 + 2;
          do {
            if (vArray->nSize <= lVar9) goto LAB_00220a6b;
            if (iVar4 != vArray->pArray[lVar9]) {
              printf("  %d x %s",uVar5,GIA_TYPE_STRINGS[iVar4]);
              if (vArray->nSize <= lVar9) goto LAB_00220a6b;
              iVar4 = vArray->pArray[lVar9];
              uVar5 = 0;
            }
            uVar5 = (ulong)((int)uVar5 + 1);
            lVar9 = lVar9 + 1;
            lVar7 = lVar7 + -1;
          } while (lVar7 != 0);
        }
        printf("  %d x %s",uVar5,GIA_TYPE_STRINGS[iVar4]);
      }
      putchar(10);
      return;
    }
  }
LAB_00220a6b:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Gia_ManProfilePrintOne( Gia_Man_t * p, int i, Vec_Int_t * vArray )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, i );
    int k, nFanins, nFanouts;
    if ( Gia_ObjIsRi(p, pObj) )
        return;
    nFanins = Gia_ObjIsRo(p, pObj) ? 1 : Gia_ObjFaninNum(p, pObj);
    nFanouts = Gia_ObjFanoutNum(p, pObj);

    printf( "%6d : ", i );
    for ( k = 0; k < nFanins; k++ )
        printf( "  %5s", GIA_TYPE_STRINGS[Vec_IntEntry(vArray, k + 1)] );
    for (      ; k < 3; k++ )
        printf( "  %5s", "" );
    printf( "  ->" );
    printf( " %5s", GIA_TYPE_STRINGS[Vec_IntEntry(vArray, 0)] );
    printf( "  ->" );
    if ( nFanouts > 0 )
    {
        int Count = 1, Prev = Vec_IntEntry(vArray, 1 + nFanins);
        for ( k = 1; k < nFanouts; k++ )
        {
            if ( Prev != Vec_IntEntry(vArray, k + 1 + nFanins) )
            {
                printf( "  %d x %s", Count, GIA_TYPE_STRINGS[Prev] );
                Prev = Vec_IntEntry(vArray, k + 1 + nFanins);
                Count = 0;
            }
            Count++;
        }
        printf( "  %d x %s", Count, GIA_TYPE_STRINGS[Prev] );
    }
    printf( "\n" );
}